

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::_::NetworkFilter::NetworkFilter(NetworkFilter *this)

{
  Vector<kj::CidrRange> *this_00;
  RemoveConst<kj::CidrRange> **ppRVar1;
  CidrRange *pCVar2;
  CidrRange *pCVar3;
  size_t sVar4;
  uint in_R8D;
  undefined1 local_34 [12];
  byte abStack_28 [8];
  undefined8 local_20;
  
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_006ddee8;
  this_00 = &this->allowCidrs;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->allowCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this->allowUnix = true;
  this->allowAbstractUnix = true;
  this->allowPublic = false;
  this->allowNetwork = false;
  (this->next).ptr = (NetworkFilter *)0x0;
  local_34._0_4_ = 0;
  CidrRange::inet4((CidrRange *)(local_34 + 4),(CidrRange *)local_34,
                   (ArrayPtr<const_unsigned_char>)ZEXT816(4),in_R8D);
  pCVar3 = (this->allowCidrs).builder.pos;
  if (pCVar3 == (this->allowCidrs).builder.endPtr) {
    pCVar2 = (this_00->builder).ptr;
    sVar4 = 4;
    if (pCVar3 != pCVar2) {
      sVar4 = ((long)pCVar3 - (long)pCVar2 >> 3) * 0x5555555555555556;
    }
    Vector<kj::CidrRange>::setCapacity(this_00,sVar4);
    pCVar3 = (this->allowCidrs).builder.pos;
  }
  *(undefined8 *)(pCVar3->bits + 0xc) = local_20;
  pCVar3->family = local_34._4_4_;
  pCVar3->bits[0] = local_34[8];
  pCVar3->bits[1] = local_34[9];
  pCVar3->bits[2] = local_34[10];
  pCVar3->bits[3] = local_34[0xb];
  *(byte (*) [8])(pCVar3->bits + 4) = abStack_28;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  CidrRange::inet6((CidrRange *)(local_34 + 4),(ArrayPtr<const_unsigned_short>)ZEXT816(0),
                   (ArrayPtr<const_unsigned_short>)ZEXT816(0),0);
  pCVar3 = (this->allowCidrs).builder.pos;
  if (pCVar3 == (this->allowCidrs).builder.endPtr) {
    pCVar2 = (this_00->builder).ptr;
    sVar4 = 4;
    if (pCVar3 != pCVar2) {
      sVar4 = ((long)pCVar3 - (long)pCVar2 >> 3) * 0x5555555555555556;
    }
    Vector<kj::CidrRange>::setCapacity(this_00,sVar4);
    pCVar3 = (this->allowCidrs).builder.pos;
  }
  *(undefined8 *)(pCVar3->bits + 0xc) = local_20;
  pCVar3->family = local_34._4_4_;
  pCVar3->bits[0] = local_34[8];
  pCVar3->bits[1] = local_34[9];
  pCVar3->bits[2] = local_34[10];
  pCVar3->bits[3] = local_34[0xb];
  *(byte (*) [8])(pCVar3->bits + 4) = abStack_28;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  return;
}

Assistant:

NetworkFilter::NetworkFilter()
    : allowUnix(true), allowAbstractUnix(true) {
  allowCidrs.add(CidrRange::inet4({0,0,0,0}, 0));
  allowCidrs.add(CidrRange::inet6({}, {}, 0));
}